

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

PathTypeHandlerWithAttr *
Js::PathTypeHandlerWithAttr::New
          (ScriptContext *scriptContext,TypePath *typePath,ObjectSlotAttributes *attributes,
          PathTypeSetterSlotIndex *setters,PathTypeSetterSlotIndex setterCount,uint16 pathLength,
          PropertyIndex slotCapacity,uint16 inlineSlotCapacity,uint16 offsetOfInlineSlots,
          bool isLocked,bool isShared,DynamicType *predecessorType)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *pRVar4;
  PathTypeHandlerWithAttr *this;
  TrackAllocData local_70;
  byte local_46;
  byte local_45;
  uint16 local_44;
  PathTypeSetterSlotIndex local_41;
  bool isShared_local;
  bool isLocked_local;
  uint16 pathLength_local;
  PathTypeSetterSlotIndex *pPStack_40;
  PathTypeSetterSlotIndex setterCount_local;
  PathTypeSetterSlotIndex *setters_local;
  ObjectSlotAttributes *attributes_local;
  TypePath *typePath_local;
  ScriptContext *scriptContext_local;
  
  local_45 = isLocked;
  local_46 = isShared;
  local_44 = pathLength;
  local_41 = setterCount;
  pPStack_40 = setters;
  setters_local = attributes;
  attributes_local = (ObjectSlotAttributes *)typePath;
  typePath_local = (TypePath *)scriptContext;
  if (typePath == (TypePath *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xde7,"(typePath != nullptr)","typePath != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  *(int *)&typePath_local[0x62].data.ptr = *(int *)&typePath_local[0x62].data.ptr + 1;
  pRVar4 = ScriptContext::GetRecycler((ScriptContext *)typePath_local);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_70,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
             ,0xdeb);
  pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_70);
  this = (PathTypeHandlerWithAttr *)new<Memory::Recycler>(0x50,pRVar4,0x43c4b0);
  PathTypeHandlerWithAttr
            (this,(TypePath *)attributes_local,setters_local,pPStack_40,local_41,local_44,
             slotCapacity,inlineSlotCapacity,offsetOfInlineSlots,(bool)(local_45 & 1),
             (bool)(local_46 & 1),predecessorType);
  return this;
}

Assistant:

PathTypeHandlerWithAttr * PathTypeHandlerWithAttr::New(ScriptContext * scriptContext, TypePath* typePath, ObjectSlotAttributes * attributes, PathTypeSetterSlotIndex * setters, PathTypeSetterSlotIndex setterCount, uint16 pathLength, const PropertyIndex slotCapacity, uint16 inlineSlotCapacity, uint16 offsetOfInlineSlots, bool isLocked, bool isShared, DynamicType* predecessorType)
    {
        Assert(typePath != nullptr);
#ifdef PROFILE_TYPES
        scriptContext->pathTypeHandlerCount++;
#endif
        return RecyclerNew(scriptContext->GetRecycler(), PathTypeHandlerWithAttr, typePath, attributes, setters, setterCount, pathLength, slotCapacity, inlineSlotCapacity, offsetOfInlineSlots, isLocked, isShared, predecessorType);
    }